

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_metric_ellipse_twod(REF_GRID ref_grid,char *root_filename)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL local_2e0;
  double local_2d8;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL scale;
  REF_DBL dt;
  REF_DBL best_z;
  int local_298;
  REF_INT eb;
  REF_INT e1;
  REF_INT e0;
  REF_INT n;
  REF_INT i;
  char viz_file [256];
  FILE *file;
  REF_DBL ey;
  REF_DBL ex;
  REF_DBL y;
  REF_DBL x;
  REF_DBL d [12];
  REF_DBL m [6];
  REF_INT nodes [27];
  int local_50;
  REF_INT cell;
  REF_INT ncell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT node;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  char *root_filename_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  snprintf((char *)&n,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
           (ulong)(uint)ref_grid->mpi->id);
  __stream = fopen((char *)&n,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",&n);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x334,
           "ref_export_tec_metric_ellipse_twod","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine metric axes\"\n");
    fprintf(__stream,"variables = \"x\" \"y\"\n");
    if (ref_node_00->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x339,"ref_export_tec_metric_ellipse_twod","malloc o2n of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)ref_node_00->max << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x339,"ref_export_tec_metric_ellipse_twod","malloc o2n of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_1 * 4) = 0xffffffff;
        }
        o2n._4_4_ = 0;
        for (local_50 = 0; local_50 < ref_cell_00->max; local_50 = local_50 + 1) {
          RVar1 = ref_cell_nodes(ref_cell_00,local_50,(REF_INT *)(m + 5));
          if (RVar1 == 0) {
            for (o2n._0_4_ = 0; (int)o2n < ref_cell_00->node_per; o2n._0_4_ = (int)o2n + 1) {
              if (*(int *)((long)__ptr + (long)nodes[(long)(int)o2n + -2] * 4) == -1) {
                *(int *)((long)__ptr + (long)nodes[(long)(int)o2n + -2] * 4) = o2n._4_4_;
                o2n._4_4_ = o2n._4_4_ + 1;
              }
            }
          }
        }
        if (o2n._4_4_ < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x344,"ref_export_tec_metric_ellipse_twod","malloc n2o of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          __ptr_00 = malloc((long)o2n._4_4_ << 2);
          if (__ptr_00 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x344,"ref_export_tec_metric_ellipse_twod","malloc n2o of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (o2n._0_4_ = 0; (int)o2n < ref_node_00->max; o2n._0_4_ = (int)o2n + 1) {
              if (*(int *)((long)__ptr + (long)(int)o2n * 4) != -1) {
                *(int *)((long)__ptr_00 + (long)*(int *)((long)__ptr + (long)(int)o2n * 4) * 4) =
                     (int)o2n;
              }
            }
            fprintf(__stream,
                    "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)(uint)(o2n._4_4_ * 0xc),(ulong)(uint)(o2n._4_4_ * 0xc),"point",
                    "felineseg");
            for (o2n._0_4_ = 0; (int)o2n < o2n._4_4_; o2n._0_4_ = (int)o2n + 1) {
              uVar2 = ref_node_metric_get(ref_node_00,
                                          *(REF_INT *)((long)__ptr_00 + (long)(int)o2n * 4),d + 0xb)
              ;
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x353,"ref_export_tec_metric_ellipse_twod",(ulong)uVar2,"get");
                return uVar2;
              }
              uVar2 = ref_matrix_diag_m(d + 0xb,&x);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x354,"ref_export_tec_metric_ellipse_twod",(ulong)uVar2,"diag");
                return uVar2;
              }
              uVar2 = ref_matrix_descending_eig(&x);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x355,"ref_export_tec_metric_ellipse_twod",(ulong)uVar2,"sort eig");
                return uVar2;
              }
              best_z._4_4_ = -1;
              dt = -1.0;
              for (eb = 0; eb < 3; eb = eb + 1) {
                if (d[(long)(eb * 3 + 5) + -1] <= 0.0) {
                  local_2d8 = -d[(long)(eb * 3 + 5) + -1];
                }
                else {
                  local_2d8 = d[(long)(eb * 3 + 5) + -1];
                }
                if (dt < local_2d8) {
                  best_z._4_4_ = eb;
                  if (d[(long)(eb * 3 + 5) + -1] <= 0.0) {
                    local_2e0 = -d[(long)(eb * 3 + 5) + -1];
                  }
                  else {
                    local_2e0 = d[(long)(eb * 3 + 5) + -1];
                  }
                  dt = local_2e0;
                }
              }
              if (best_z._4_4_ == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x35e,"ref_export_tec_metric_ellipse_twod","couldn\'t find best y");
                return 1;
              }
              eb = best_z._4_4_ + 1;
              if (2 < eb) {
                eb = best_z._4_4_ + -2;
              }
              local_298 = best_z._4_4_ + 2;
              if (2 < local_298) {
                local_298 = best_z._4_4_ + -1;
              }
              for (e0 = 0; e0 < 0xc; e0 = e0 + 1) {
                dVar3 = cos((double)e0 * 0.5235987755982983);
                dVar4 = sqrt(d[(long)eb + -1]);
                dVar5 = sin((double)e0 * 0.5235987755982983);
                dVar6 = sqrt(d[(long)local_298 + -1]);
                fprintf(__stream," %.16e %.16e\n",
                        ref_node_00->real[*(int *)((long)__ptr_00 + (long)(int)o2n * 4) * 0xf] +
                        d[(long)(eb * 3 + 3) + -1] * ((dVar3 * 0.5) / dVar4) +
                        d[(long)(local_298 * 3 + 3) + -1] * ((dVar5 * 0.5) / dVar6));
              }
            }
            for (o2n._0_4_ = 0; (int)o2n < o2n._4_4_; o2n._0_4_ = (int)o2n + 1) {
              for (e0 = 0; e0 < 0xb; e0 = e0 + 1) {
                fprintf(__stream," %d %d\n",(ulong)(e0 + (int)o2n * 0xc + 1),
                        (ulong)(e0 + (int)o2n * 0xc + 2));
              }
              fprintf(__stream," %d %d\n",(ulong)((int)o2n * 0xc + 0xc),(ulong)((int)o2n * 0xc + 1))
              ;
            }
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            ref_grid_local._4_4_ = ref_export_tec_twod_zone(ref_grid,(FILE *)__stream);
            if (ref_grid_local._4_4_ == 0) {
              fclose(__stream);
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x377,"ref_export_tec_metric_ellipse_twod",(ulong)ref_grid_local._4_4_,
                     "ellipse surf");
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_metric_ellipse_twod(
    REF_GRID ref_grid, const char *root_filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nnode, node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], d[12];
  REF_DBL x, y;
  REF_DBL ex, ey;
  FILE *file;
  char viz_file[256];
  REF_INT i, n = 12;
  REF_INT e0, e1, eb;
  REF_DBL best_z;
  REF_DBL dt = ref_math_in_radians(360.0 / (REF_DBL)n);
  REF_DBL scale = 0.5; /* so the ellipses touch for an ideal grid */

  snprintf(viz_file, 256, "%s_n%d_p%d_ellipse.tec", root_filename,
           ref_mpi_n(ref_grid_mpi(ref_grid)),
           ref_mpi_rank(ref_grid_mpi(ref_grid)));

  file = fopen(viz_file, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", viz_file);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine metric axes\"\n");
  fprintf(file, "variables = \"x\" \"y\"\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  nnode = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }
    }
  }

  ref_malloc(n2o, nnode, REF_INT);
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != o2n[node]) {
      n2o[o2n[node]] = node;
    }
  }

  ncell = nnode * n;

  fprintf(file,
          "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          1 * ncell, 1 * ncell, "point", "felineseg");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_metric_get(ref_node, n2o[node], m), "get");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_descending_eig(d), "sort eig");
    eb = REF_EMPTY;
    best_z = -1.0;
    for (e0 = 0; e0 < 3; e0++) {
      if (ABS(ref_matrix_vec(d, 2, e0)) > best_z) {
        eb = e0;
        best_z = ABS(ref_matrix_vec(d, 2, e0));
      }
    }
    RUS(REF_EMPTY, eb, "couldn't find best y");
    e0 = eb + 1;
    if (e0 > 2) e0 -= 3;
    e1 = eb + 2;
    if (e1 > 2) e1 -= 3;
    for (i = 0; i < n; i++) {
      ex = scale * cos(i * dt) / sqrt(d[e0]);
      ey = scale * sin(i * dt) / sqrt(d[e1]);
      x = d[3 + 3 * e0] * ex + d[3 + 3 * e1] * ey;
      y = d[4 + 3 * e0] * ex + d[4 + 3 * e1] * ey;
      fprintf(file, " %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]) + x,
              ref_node_xyz(ref_node, 1, n2o[node]) + y);
    }
  }

  e0 = 0;
  for (node = 0; node < nnode; node++) {
    for (i = 0; i < n - 1; i++)
      fprintf(file, " %d %d\n", i + node * n + 1, i + 1 + node * n + 1);
    fprintf(file, " %d %d\n", n + node * n, 1 + node * n);
  }

  ref_free(n2o);
  ref_free(o2n);

  RSS(ref_export_tec_twod_zone(ref_grid, file), "ellipse surf");

  fclose(file);

  return REF_SUCCESS;
}